

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContinuumMaterial.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChContinuumElastic::ArchiveIN(ChContinuumElastic *this,ChArchiveIn *marchive)

{
  ChNameValue<double> local_78;
  ChNameValue<double> local_60;
  ChNameValue<double> local_48;
  ChNameValue<double> local_30;
  
  ChArchiveIn::VersionRead<chrono::fea::ChContinuumElastic>(marchive);
  ChContinuumMaterial::ArchiveIN(&this->super_ChContinuumMaterial,marchive);
  local_30._value = &this->E;
  local_30._name = "this->E";
  local_30._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_30);
  local_48._value = &this->v;
  local_48._name = "this->v";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  Set_v(this,this->v);
  local_60._value = &this->damping_M;
  local_60._name = "this->damping_M";
  local_60._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_60);
  local_78._value = &this->damping_K;
  local_78._name = "this->damping_K";
  local_78._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_78);
  return;
}

Assistant:

void ChContinuumElastic::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChContinuumElastic>();
    // deserialize parent class
    ChContinuumMaterial::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(this->E);
    marchive >> CHNVP(this->v);
    this->Set_v(this->v);  // G and l from v
    marchive >> CHNVP(this->damping_M);
    marchive >> CHNVP(this->damping_K);
}